

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-i2c.c
# Opt level: O0

mraa_result_t i2c_set(int bus,uint8_t device_address,uint8_t register_address,uint8_t data)

{
  long lVar1;
  mraa_i2c_context i2c;
  mraa_result_t status;
  uint8_t data_local;
  uint8_t register_address_local;
  mraa_result_t mStack_c;
  uint8_t device_address_local;
  int bus_local;
  
  lVar1 = mraa_i2c_init(bus);
  if (lVar1 == 0) {
    mStack_c = MRAA_ERROR_NO_RESOURCES;
  }
  else {
    i2c._0_4_ = mraa_i2c_address(lVar1,device_address);
    if ((mraa_result_t)i2c == MRAA_SUCCESS) {
      i2c._0_4_ = mraa_i2c_write_byte_data(lVar1,data,register_address);
      if ((mraa_result_t)i2c != MRAA_SUCCESS) {
        fprintf(_stderr,"Could not write to i2c register. Status = %d\n",(ulong)(mraa_result_t)i2c);
      }
    }
    else {
      fprintf(_stderr,"Could not set i2c device address\n");
    }
    mraa_i2c_stop(lVar1);
    mStack_c = (mraa_result_t)i2c;
  }
  return mStack_c;
}

Assistant:

mraa_result_t
i2c_set(int bus, uint8_t device_address, uint8_t register_address, uint8_t data)
{
    mraa_result_t status = MRAA_SUCCESS;
    mraa_i2c_context i2c = mraa_i2c_init(bus);
    if (i2c == NULL) {
        return MRAA_ERROR_NO_RESOURCES;
    }
    status = mraa_i2c_address(i2c, device_address);
    if (status != MRAA_SUCCESS) {
        fprintf(stderr, "Could not set i2c device address\n");
        goto i2c_set_exit;
    }
    status = mraa_i2c_write_byte_data(i2c, data, register_address);
    if (status != MRAA_SUCCESS) {
        fprintf(stderr, "Could not write to i2c register. Status = %d\n", status);
        goto i2c_set_exit;
    }
i2c_set_exit:
    mraa_i2c_stop(i2c);
    return status;
}